

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O0

void cmn_live_shiftwin(cmn_t *cmn)

{
  int iVar1;
  int local_18;
  int32 i;
  mfcc_t sf;
  cmn_t *cmn_local;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
          ,0x58,"Update from < ");
  for (local_18 = 0; local_18 < cmn->veclen; local_18 = local_18 + 1) {
    err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[local_18]);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
  iVar1 = cmn->nframe;
  for (local_18 = 0; local_18 < cmn->veclen; local_18 = local_18 + 1) {
    cmn->cmn_mean[local_18] = (mfcc_t)((float)cmn->sum[local_18] / (float)cmn->nframe);
  }
  if (799 < cmn->nframe) {
    for (local_18 = 0; local_18 < cmn->veclen; local_18 = local_18 + 1) {
      cmn->sum[local_18] = (mfcc_t)((float)cmn->sum[local_18] * (1.0 / (float)iVar1) * 500.0);
    }
    cmn->nframe = 500;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
          ,0x69,"Update to   < ");
  for (local_18 = 0; local_18 < cmn->veclen; local_18 = local_18 + 1) {
    err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[local_18]);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
  return;
}

Assistant:

static void
cmn_live_shiftwin(cmn_t *cmn)
{
    mfcc_t sf;
    int32 i;

    E_INFO("Update from < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");

    sf = FLOAT2MFCC(1.0) / cmn->nframe;
    for (i = 0; i < cmn->veclen; i++)
        cmn->cmn_mean[i] = cmn->sum[i] / cmn->nframe; /* sum[i] * sf */

    /* Make the accumulation decay exponentially */
    if (cmn->nframe >= CMN_WIN_HWM) {
        sf = CMN_WIN * sf;
        for (i = 0; i < cmn->veclen; i++)
            cmn->sum[i] = MFCCMUL(cmn->sum[i], sf);
        cmn->nframe = CMN_WIN;
    }

    E_INFO("Update to   < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");
}